

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::dht_log_alert::message_abi_cxx11_(string *__return_storage_ptr__,dht_log_alert *this)

{
  int iVar1;
  char *pcVar2;
  char ret [900];
  allocator<char> local_3a9;
  char local_3a8 [912];
  
  iVar1 = *(int *)(_ZZNK10libtorrent13dht_log_alert7messageB5cxx11EvE11dht_modules_rel +
                  (ulong)this->module * 4);
  pcVar2 = log_message(this);
  snprintf(local_3a8,900,"DHT %s: %s",
           _ZZNK10libtorrent13dht_log_alert7messageB5cxx11EvE11dht_modules_rel + iVar1,pcVar2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_3a8,&local_3a9);
  return __return_storage_ptr__;
}

Assistant:

std::string dht_log_alert::message() const
	{
		static char const* const dht_modules[] =
		{
			"tracker",
			"node",
			"routing_table",
			"rpc_manager",
			"traversal"
		};

		char ret[900];
		std::snprintf(ret, sizeof(ret), "DHT %s: %s", dht_modules[module]
			, log_message());
		return ret;
	}